

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pu.cpp
# Opt level: O3

void __thiscall PU_twoBaseValues_Test::TestBody(PU_twoBaseValues_Test *this)

{
  unit_data uVar1;
  unit uVar2;
  char *pcVar3;
  double unaff_R12;
  double unaff_R14;
  double unaff_R15;
  AssertionResult gtest_ar;
  char *in_stack_ffffffffffffffb8;
  unit local_38;
  internal local_30 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  
  local_38 = (unit)units::convert<units::unit,units::unit>
                             (1.47,(unit *)&units::ohm,(unit *)&units::defunit,24.7,92.3);
  uVar2.multiplier_ = -5.0048828e-05;
  uVar2.base_units_ = (unit_data)0x3ff7851e;
  testing::internal::CmpHelperEQ<double,double>
            (local_30,"convert(1.47, ohm, defunit, 24.7, 92.3)","1.47",(double *)&local_38,
             (double *)&stack0xffffffffffffffc0);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_pu.cpp",
               0x3d,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffc0,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc0);
    if (local_38 != (unit)0x0) {
      (**(code **)(*(long *)local_38 + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  units::convert<units::unit,units::unit>(1.0,(unit *)&units::in,(unit *)&units::cm,5.7,19.36);
  testing::internal::DoubleNearPredFormat
            ((char *)uVar2,in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffd8,unaff_R15,
             unaff_R14,unaff_R12);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_pu.cpp",
               0x3e,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffc0,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc0);
    if (local_38 != (unit)0x0) {
      (**(code **)(*(long *)local_38 + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  units::convert<units::unit,units::unit>
            (4.5,(unit *)&units::puMW,(unit *)&units::puA,100.0,80000.0);
  testing::internal::DoubleNearPredFormat
            ((char *)uVar2,in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffd8,unaff_R15,
             unaff_R14,unaff_R12);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_pu.cpp",
               0x40,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffc0,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc0);
    if (local_38 != (unit)0x0) {
      (**(code **)(*(long *)local_38 + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  units::convert<units::unit,units::unit>(4.5,(unit *)&units::puMW,(unit *)&units::puMW,100.0,80.0);
  testing::internal::DoubleNearPredFormat
            ((char *)uVar2,in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffd8,unaff_R15,
             unaff_R14,unaff_R12);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_pu.cpp",
               0x42,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffc0,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc0);
    if (local_38 != (unit)0x0) {
      (**(code **)(*(long *)local_38 + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  uVar1 = units::detail::unit_data::operator*
                    ((unit_data *)((long)&units::pu + 4),(unit_data *)((long)&units::m + 4));
  local_38 = (unit)((ulong)(uint)uVar1 << 0x20 | 0x3f800000);
  uVar1 = units::detail::unit_data::operator*
                    ((unit_data *)((long)&units::pu + 4),(unit_data *)((long)&units::m + 4));
  uVar2 = (unit)((ulong)(uint)uVar1 << 0x20 | 0x3f800000);
  units::convert<units::unit,units::unit>(4.5,&local_38,(unit *)&stack0xffffffffffffffc0,100.0,80.0)
  ;
  testing::internal::DoubleNearPredFormat
            ((char *)uVar2,in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffd8,unaff_R15,
             unaff_R14,unaff_R12);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_pu.cpp",
               0x45,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffc0,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc0);
    if (local_38 != (unit)0x0) {
      (**(code **)(*(long *)local_38 + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  uVar1 = units::detail::unit_data::operator*
                    ((unit_data *)((long)&units::pu + 4),(unit_data *)((long)&units::m + 4));
  local_38 = (unit)((ulong)(uint)uVar1 << 0x20 | 0x3f800000);
  uVar1 = units::detail::unit_data::operator*
                    ((unit_data *)((long)&units::pu + 4),(unit_data *)((long)&units::mm + 4));
  uVar2 = (unit)((ulong)(uint)uVar1 << 0x20 | 0x3a83126f);
  units::convert<units::unit,units::unit>(0.1,&local_38,(unit *)&stack0xffffffffffffffc0,1.0,10.0);
  testing::internal::DoubleNearPredFormat
            ((char *)uVar2,in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffd8,unaff_R15,
             unaff_R14,unaff_R12);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (in_stack_ffffffffffffffd8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (in_stack_ffffffffffffffd8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_pu.cpp",
               0x47,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffc0,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc0);
    if (local_38 != (unit)0x0) {
      (**(code **)(*(long *)local_38 + 8))();
    }
  }
  if (in_stack_ffffffffffffffd8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

TEST(PU, twoBaseValues)
{
    EXPECT_EQ(convert(1.47, ohm, defunit, 24.7, 92.3), 1.47);
    EXPECT_NEAR(convert(1.0, in, cm, 5.7, 19.36), 2.54, test::tolerance);

    EXPECT_NEAR(convert(4.5, puMW, puA, 100, 80000), 4.5, 0.00001);

    EXPECT_NEAR(convert(4.5, puMW, puMW, 100, 80), 4.5, 0.00001);

    EXPECT_NEAR(
        convert(4.5, pu * m, pu * m, 100, 80), 4.5 * 10.0 / 8.0, 0.00001);

    EXPECT_NEAR(convert(0.1, pu * m, pu * mm, 1.0, 10), 10.0, 0.00001);
}